

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcSpfd.c
# Opt level: O0

void Bdc_SpfdDecomposeTest8(void)

{
  uint uVar1;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  abctime clk;
  uint local_38;
  int i;
  int CostBest;
  int Cost;
  word FuncBest;
  word Func;
  Vec_Wrd_t *vDivs;
  Vec_Int_t *vWeights;
  word t;
  
  vWeights = (Vec_Int_t *)0x513b57150819050f;
  local_38 = 1000000000;
  aVar3 = Abc_Clock();
  Func = (word)Bdc_SpfdReadFiles5((Vec_Int_t **)&vDivs);
  uVar1 = Bdc_SpfdAdjCost((word)vWeights);
  printf("Best init = %4d.  ",(ulong)uVar1);
  Extra_PrintHex(_stdout,(uint *)&vWeights,6);
  aVar4 = Abc_Clock();
  Abc_PrintTime(1,"  Time",aVar4 - aVar3);
  for (clk._4_4_ = 0; iVar2 = Vec_WrdSize((Vec_Wrd_t *)Func), clk._4_4_ < iVar2;
      clk._4_4_ = clk._4_4_ + 1) {
    FuncBest = Vec_WrdEntry((Vec_Wrd_t *)Func,clk._4_4_);
    uVar1 = Bdc_SpfdAdjCost((ulong)vWeights ^ FuncBest);
    if ((int)uVar1 < (int)local_38) {
      _CostBest = FuncBest;
      local_38 = uVar1;
    }
  }
  printf("Best cost = %4d.  ",(ulong)local_38);
  Extra_PrintHex(_stdout,(uint *)&CostBest,6);
  aVar4 = Abc_Clock();
  Abc_PrintTime(1,"  Time",aVar4 - aVar3);
  Abc_Show6VarFunc(0,(word)vWeights);
  Abc_Show6VarFunc(0,_CostBest);
  Abc_Show6VarFunc(0,_CostBest ^ (ulong)vWeights);
  _CostBest = (ulong)vWeights ^ _CostBest;
  Extra_PrintHex(_stdout,(uint *)&CostBest,6);
  printf("\n");
  return;
}

Assistant:

void Bdc_SpfdDecomposeTest8()
{
//    word t = 0x9ef7a8d9c7193a0f;
//    word t = 0x9EF7FDBFC77F6F0F;
    word t = ABC_CONST(0x513B57150819050F);

    Vec_Int_t * vWeights;
    Vec_Wrd_t * vDivs;
    word Func, FuncBest;
    int Cost, CostBest = ABC_INFINITY;
    int i;
    abctime clk = Abc_Clock();

//    return;

    vDivs = Bdc_SpfdReadFiles5( &vWeights );

    printf( "Best init = %4d.  ", Bdc_SpfdAdjCost(t) );
    Extra_PrintHex( stdout, (unsigned *)&t, 6 ); //printf( "\n" );
    Abc_PrintTime( 1, "  Time", Abc_Clock() - clk );

    Vec_WrdForEachEntry( vDivs, Func, i )
    {
        Cost = Bdc_SpfdAdjCost( t ^ Func );
        if ( CostBest > Cost )
        {
            CostBest = Cost;
            FuncBest = Func;
        }
    }

    printf( "Best cost = %4d.  ", CostBest );
    Extra_PrintHex( stdout, (unsigned *)&FuncBest, 6 ); //printf( "\n" );
    Abc_PrintTime( 1, "  Time", Abc_Clock() - clk );

Abc_Show6VarFunc( 0, t );
Abc_Show6VarFunc( 0, FuncBest );
Abc_Show6VarFunc( 0, (FuncBest ^ t) );

    FuncBest ^= t;
    Extra_PrintHex( stdout, (unsigned *)&FuncBest, 6 ); printf( "\n" );

}